

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

void Blindf_on(obj *otmp)

{
  bool bVar1;
  
  if ((u.uprops[0x1e].intrinsic == 0) &&
     (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
    bVar1 = false;
  }
  else if (ublindf == (obj *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = ublindf->oartifact != '\x1d';
  }
  if (uwep == otmp) {
    setuwep((obj *)0x0);
  }
  if (uswapwep == otmp) {
    setuswapwep((obj *)0x0);
  }
  if (uquiver == otmp) {
    setuqwep((obj *)0x0);
  }
  setworn(otmp,0x80000);
  discover_cursed_equip(otmp);
  on_msg(otmp,'\x01');
  if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
     (((youmonst.data)->mflags1 & 0x1000) == 0)) {
LAB_001853be:
    if (!bVar1) {
      return;
    }
  }
  else {
    if (ublindf != (obj *)0x0) {
      if ((ublindf->oartifact != '\x1d') && (!bVar1)) goto LAB_001853ef;
      goto LAB_001853be;
    }
    if (!bVar1) {
LAB_001853ef:
      if (flags.verbose != '\0') {
        pline("You can\'t see any more.");
      }
      if (uball != (obj *)0x0) {
        set_bc(0);
      }
      goto LAB_00185456;
    }
  }
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    if (ublindf == (obj *)0x0) {
      return;
    }
    if (ublindf->oartifact != '\x1d') {
      return;
    }
  }
  pline("You can see!");
LAB_00185456:
  if (((((youmonst.data == mons + 0x32 ||
         (youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e)) ||
        (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) &&
        u.uprops[0x19].blocked == 0) || (u.uprops[0x40].intrinsic != 0)) ||
     ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) {
    see_monsters();
  }
  vision_full_recalc = '\x01';
  iflags.botl = '\x01';
  return;
}

Assistant:

void Blindf_on(struct obj *otmp)
{
	boolean already_blind = Blind, changed = FALSE;

	if (otmp == uwep)
	    setuwep(NULL);
	if (otmp == uswapwep)
	    setuswapwep(NULL);
	if (otmp == uquiver)
	    setuqwep(NULL);
	setworn(otmp, W_TOOL);
	discover_cursed_equip(otmp);
	on_msg(otmp, TRUE);

	if (Blind && !already_blind) {
	    changed = TRUE;
	    if (flags.verbose) pline("You can't see any more.");
	    /* set ball&chain variables before the hero goes blind */
	    if (Punished) set_bc(0);
	} else if (already_blind && !Blind) {
	    changed = TRUE;
	    /* "You are now wearing the Eyes of the Overworld." */
	    pline("You can see!");
	}
	if (changed) {
	    /* blindness has just been toggled */
	    if (Blind_telepat || Infravision) see_monsters();
	    vision_full_recalc = 1;	/* recalc vision limits */
	    iflags.botl = 1;
	}
}